

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O3

char * crnlib::strcpy_safe(char *pDst,size_t dst_len,char *pSrc)

{
  char cVar1;
  long lVar2;
  
  if (dst_len != 0) {
    lVar2 = 0;
    do {
      if (dst_len - 1 == lVar2) {
        pDst[lVar2] = '\0';
        return pDst;
      }
      cVar1 = pSrc[lVar2];
      pDst[lVar2] = cVar1;
      lVar2 = lVar2 + 1;
    } while (cVar1 != '\0');
  }
  return pDst;
}

Assistant:

char* strcpy_safe(char* pDst, size_t dst_len, const char* pSrc) {
  CRNLIB_ASSERT(pDst && pSrc && dst_len);
  if (!dst_len)
    return pDst;

  char* q = pDst;
  char c;

  do {
    if (dst_len == 1) {
      *q++ = '\0';
      break;
    }

    c = *pSrc++;
    *q++ = c;

    dst_len--;

  } while (c);

  CRNLIB_ASSERT((q - pDst) <= (int)dst_len);

  return pDst;
}